

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsbndmat.cpp
# Opt level: O2

void __thiscall TPZSBMatrix<double>::TPZSBMatrix(TPZSBMatrix<double> *this,int64_t dim,int64_t band)

{
  int64_t iVar1;
  long lVar2;
  
  TPZMatrix<double>::TPZMatrix(&this->super_TPZMatrix<double>,&PTR_PTR_0169bb80,dim,dim);
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSBMatrix_0169b900;
  (this->fDiag)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649128;
  (this->fDiag).fStore = (double *)0x0;
  (this->fDiag).fNElements = 0;
  (this->fDiag).fNAlloc = 0;
  lVar2 = dim + -1;
  if (band <= dim + -1) {
    lVar2 = band;
  }
  this->fBand = lVar2;
  iVar1 = TPZBaseMatrix::Dim((TPZBaseMatrix *)this);
  (*(this->fDiag)._vptr_TPZVec[3])(&this->fDiag,(this->fBand + 1) * iVar1);
  (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (this);
  return;
}

Assistant:

TPZSBMatrix<TVar>::TPZSBMatrix( int64_t dim, int64_t band )
: TPZRegisterClassId(&TPZSBMatrix::ClassId),
TPZMatrix<TVar>( dim, dim )
{
    fBand = ( band > (dim - 1) ? (dim - 1) : band );
    fDiag.resize(Size());
    
    Zero();
}